

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O3

void __thiscall
ctemplate::PrefixLine::Modify
          (PrefixLine *this,char *in,size_t inlen,PerExpandData *param_3,ExpandEmitter *out,
          string *arg)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  size_t __n;
  
  if (inlen != 0) {
    do {
      pcVar1 = (char *)memchr(in,10,inlen);
      __n = (long)pcVar1 - (long)in;
      if (pcVar1 == (char *)0x0) {
        __n = inlen;
      }
      pcVar2 = (char *)memchr(in,0xd,__n);
      if (pcVar1 == (char *)0x0 && pcVar2 == (char *)0x0) {
        (*out->_vptr_ExpandEmitter[5])(out,in,inlen);
        return;
      }
      if ((pcVar1 == (char *)0x0) == (pcVar2 == (char *)0x0)) {
        pcVar3 = pcVar2 + 1;
        if (pcVar1 == pcVar2 + 1) {
          pcVar3 = pcVar1 + 1;
        }
        if (pcVar1 < pcVar2) {
          pcVar3 = pcVar1 + 1;
        }
      }
      else {
        if (pcVar1 != (char *)0x0) {
          pcVar2 = pcVar1;
        }
        pcVar3 = pcVar2 + 1;
      }
      (*out->_vptr_ExpandEmitter[5])(out,in,(long)pcVar3 - (long)in);
      (*out->_vptr_ExpandEmitter[3])(out,arg);
      inlen = inlen - ((long)pcVar3 - (long)in);
      in = pcVar3;
    } while (inlen != 0);
  }
  return;
}

Assistant:

void PrefixLine::Modify(const char* in, size_t inlen,
                        const PerExpandData*,
                        ExpandEmitter* out, const string& arg) const {
  while (inlen > 0) {
    const char* nl = (const char*)memchr(in, '\n', inlen);
    const char* cr = (const char*)memchr(in, '\r', nl ? nl - in : inlen);
    size_t linelen;
    if (nl == NULL && cr == NULL) {
      // We're at the last line
      out->Emit(in, inlen);
      break;
    } else {
      // One or both of \r and \n is set; point to the first char past
      // the newline.  Note for \r\n, that's the char after the \n,
      // otherwise, it's the char past the \r or the \n we see.
      if ((nl == NULL) != (cr == NULL))     // one is set, the other is NULL
        linelen = (nl ? nl : cr) + 1 - in;
      else if (nl == cr + 1 || nl < cr)     // \r\n, or \n comes first
        linelen = nl + 1 - in;
      else
        linelen = cr + 1 - in;
    }
    out->Emit(in, linelen);
    out->Emit(arg);               // a new line, so emit the prefix
    in += linelen;
    inlen -= linelen;
    assert(inlen >= 0);
  }
}